

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O2

void __thiscall helics::CustomMessageOperator::~CustomMessageOperator(CustomMessageOperator *this)

{
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__CustomMessageOperator_004b6240;
  std::_Function_base::~_Function_base(&(this->messageFunction).super__Function_base);
  return;
}

Assistant:

class HELICS_CXX_EXPORT CustomMessageOperator: public FilterOperator {
  public:
    /** default constructor*/
    CustomMessageOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit CustomMessageOperator(
        std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction);
    /** set the function to modify the data of the message*/
    void setMessageFunction(
        std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction);

  private:
    std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)>
        messageFunction;  //!< the function actually doing the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}